

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckSanitizerOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *result)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  string local_720 [36];
  value_type_conflict2 local_6fc;
  ulong local_6f8;
  size_type idx;
  string local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  undefined1 local_690 [8];
  string resultFound;
  string *l;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ostringstream ostr;
  undefined1 local_4d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  undefined1 local_4b8 [4];
  int defects;
  RegularExpression leakWarning;
  RegularExpression sanitizerWarning;
  undefined1 local_48 [8];
  string regex;
  vector<int,_std::allocator<int>_> *result_local;
  string *log_local;
  string *str_local;
  cmCTestMemCheckHandler *this_local;
  
  regex.field_2._8_8_ = result;
  std::__cxx11::string::string((string *)local_48);
  switch(this->MemoryTesterStyle) {
  case 6:
    std::__cxx11::string::operator=((string *)local_48,"ERROR: AddressSanitizer: (.*) on.*");
    break;
  case 7:
    break;
  case 8:
    std::__cxx11::string::operator=
              ((string *)local_48,"WARNING: ThreadSanitizer: (.*) \\(pid=.*\\)");
    break;
  case 9:
    std::__cxx11::string::operator=((string *)local_48,"WARNING: MemorySanitizer: (.*)");
    break;
  case 10:
    std::__cxx11::string::operator=((string *)local_48,"runtime error: (.*)");
  }
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&leakWarning.progsize,(string *)local_48);
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)local_4b8,"(Direct|Indirect) leak of .*");
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_4d8);
  cmsys::SystemTools::Split
            (str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4d8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
  std::__cxx11::string::clear();
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_4d8);
  l = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4d8);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&l), bVar1) {
    resultFound.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_690);
    bVar1 = cmsys::RegularExpression::find
                      ((RegularExpression *)local_4b8,(string *)resultFound.field_2._8_8_);
    if (bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_(&local_6d0,(RegularExpression *)local_4b8,1);
      std::operator+(&local_6b0,&local_6d0," leak");
      std::__cxx11::string::operator=((string *)local_690,(string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_6d0);
    }
    else {
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)&leakWarning.progsize,
                         (string *)resultFound.field_2._8_8_);
      if (bVar1) {
        cmsys::RegularExpression::match_abi_cxx11_
                  ((string *)&idx,(RegularExpression *)&leakWarning.progsize,1);
        std::__cxx11::string::operator=((string *)local_690,(string *)&idx);
        std::__cxx11::string::~string((string *)&idx);
      }
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      local_6f8 = FindOrAddWarning(this,(string *)local_690);
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)regex.field_2._8_8_);
      uVar2 = local_6f8;
      if ((bVar1) ||
         (sVar3 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)regex.field_2._8_8_),
         sVar3 - 1 < uVar2)) {
        local_6fc = 1;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)regex.field_2._8_8_,&local_6fc);
      }
      else {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)regex.field_2._8_8_,local_6f8);
        *pvVar4 = *pvVar4 + 1;
      }
      lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      poVar5 = std::operator<<((ostream *)&__range1,"<b>");
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->ResultStrings,local_6f8);
      poVar5 = std::operator<<(poVar5,(string *)pvVar6);
      std::operator<<(poVar5,"</b> ");
    }
    poVar5 = std::operator<<((ostream *)&__range1,(string *)resultFound.field_2._8_8_);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_690);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)log,local_720);
  std::__cxx11::string::~string(local_720);
  this->DefectCount =
       lines.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + this->DefectCount;
  bVar1 = lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4d8);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_4b8);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&leakWarning.progsize);
  std::__cxx11::string::~string((string *)local_48);
  return bVar1;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckSanitizerOutput(
  const std::string& str, std::string& log, std::vector<int>& result)
{
  std::string regex;
  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
      regex = "ERROR: AddressSanitizer: (.*) on.*";
      break;
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
      // use leakWarning regex
      break;
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
      regex = "WARNING: ThreadSanitizer: (.*) \\(pid=.*\\)";
      break;
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
      regex = "WARNING: MemorySanitizer: (.*)";
      break;
    case cmCTestMemCheckHandler::UB_SANITIZER:
      regex = "runtime error: (.*)";
      break;
    default:
      break;
  }
  cmsys::RegularExpression sanitizerWarning(regex);
  cmsys::RegularExpression leakWarning("(Direct|Indirect) leak of .*");
  int defects = 0;
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  std::ostringstream ostr;
  log.clear();
  for (std::string const& l : lines) {
    std::string resultFound;
    if (leakWarning.find(l)) {
      resultFound = leakWarning.match(1) + " leak";
    } else if (sanitizerWarning.find(l)) {
      resultFound = sanitizerWarning.match(1);
    }
    if (!resultFound.empty()) {
      std::vector<int>::size_type idx = this->FindOrAddWarning(resultFound);
      if (result.empty() || idx > result.size() - 1) {
        result.push_back(1);
      } else {
        result[idx]++;
      }
      defects++;
      ostr << "<b>" << this->ResultStrings[idx] << "</b> ";
    }
    ostr << l << std::endl;
  }
  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}